

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode inflate_stream(connectdata *conn,SingleRequest *k)

{
  uInt uVar1;
  Bytef *pBVar2;
  bool bVar3;
  int iVar4;
  CURLcode CVar5;
  z_stream *z_00;
  Bytef *ptr;
  char *decomp;
  CURLcode result;
  int status;
  Bytef *orig_in;
  uInt nread;
  z_stream *z;
  int allow_restart;
  SingleRequest *k_local;
  connectdata *conn_local;
  
  bVar3 = true;
  z_00 = &k->z;
  uVar1 = (k->z).avail_in;
  pBVar2 = z_00->next_in;
  ptr = (Bytef *)(*Curl_cmalloc)(0x4000);
  if (ptr == (Bytef *)0x0) {
    conn_local._4_4_ = exit_zlib(z_00,&k->zlib_init,CURLE_OUT_OF_MEMORY);
  }
  else {
    do {
      while( true ) {
        (k->z).next_out = ptr;
        (k->z).avail_out = 0x4000;
        iVar4 = inflate(z_00,2);
        if ((iVar4 == 0) || (iVar4 == 1)) break;
        if ((!bVar3) || (iVar4 != -3)) {
          (*Curl_cfree)(ptr);
          CVar5 = process_zlib_error(conn,z_00);
          CVar5 = exit_zlib(z_00,&k->zlib_init,CVar5);
          return CVar5;
        }
        inflateEnd(z_00);
        iVar4 = inflateInit2_(z_00,0xfffffff1,"1.2.11",0x70);
        if (iVar4 != 0) {
          (*Curl_cfree)(ptr);
          CVar5 = process_zlib_error(conn,z_00);
          CVar5 = exit_zlib(z_00,&k->zlib_init,CVar5);
          return CVar5;
        }
        z_00->next_in = pBVar2;
        (k->z).avail_in = uVar1;
        bVar3 = false;
      }
      bVar3 = false;
      if (((k->z).avail_out != 0x4000) &&
         (((k->ignorebody & 1U) == 0 &&
          (CVar5 = Curl_client_write(conn,1,(char *)ptr,(ulong)(0x4000 - (k->z).avail_out)),
          CVar5 != CURLE_OK)))) {
        (*Curl_cfree)(ptr);
        CVar5 = exit_zlib(z_00,&k->zlib_init,CVar5);
        return CVar5;
      }
      if (iVar4 == 1) {
        (*Curl_cfree)(ptr);
        iVar4 = inflateEnd(z_00);
        if (iVar4 == 0) {
          CVar5 = exit_zlib(z_00,&k->zlib_init,CURLE_OK);
          return CVar5;
        }
        CVar5 = process_zlib_error(conn,z_00);
        CVar5 = exit_zlib(z_00,&k->zlib_init,CVar5);
        return CVar5;
      }
    } while ((k->z).avail_in != 0);
    (*Curl_cfree)(ptr);
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode
inflate_stream(struct connectdata *conn,
               struct SingleRequest *k)
{
  int allow_restart = 1;
  z_stream *z = &k->z;          /* zlib state structure */
  uInt nread = z->avail_in;
  Bytef *orig_in = z->next_in;
  int status;                   /* zlib status */
  CURLcode result = CURLE_OK;   /* Curl_client_write status */
  char *decomp;                 /* Put the decompressed data here. */

  /* Dynamically allocate a buffer for decompression because it's uncommonly
     large to hold on the stack */
  decomp = malloc(DSIZ);
  if(decomp == NULL) {
    return exit_zlib(z, &k->zlib_init, CURLE_OUT_OF_MEMORY);
  }

  /* because the buffer size is fixed, iteratively decompress and transfer to
     the client via client_write. */
  for(;;) {
    /* (re)set buffer for decompressed output for every iteration */
    z->next_out = (Bytef *)decomp;
    z->avail_out = DSIZ;

    status = inflate(z, Z_SYNC_FLUSH);
    if(status == Z_OK || status == Z_STREAM_END) {
      allow_restart = 0;
      if((DSIZ - z->avail_out) && (!k->ignorebody)) {
        result = Curl_client_write(conn, CLIENTWRITE_BODY, decomp,
                                   DSIZ - z->avail_out);
        /* if !CURLE_OK, clean up, return */
        if(result) {
          free(decomp);
          return exit_zlib(z, &k->zlib_init, result);
        }
      }

      /* Done? clean up, return */
      if(status == Z_STREAM_END) {
        free(decomp);
        if(inflateEnd(z) == Z_OK)
          return exit_zlib(z, &k->zlib_init, result);
        else
          return exit_zlib(z, &k->zlib_init, process_zlib_error(conn, z));
      }

      /* Done with these bytes, exit */

      /* status is always Z_OK at this point! */
      if(z->avail_in == 0) {
        free(decomp);
        return result;
      }
    }
    else if(allow_restart && status == Z_DATA_ERROR) {
      /* some servers seem to not generate zlib headers, so this is an attempt
         to fix and continue anyway */

      (void) inflateEnd(z);     /* don't care about the return code */
      if(inflateInit2(z, -MAX_WBITS) != Z_OK) {
        free(decomp);
        return exit_zlib(z, &k->zlib_init, process_zlib_error(conn, z));
      }
      z->next_in = orig_in;
      z->avail_in = nread;
      allow_restart = 0;
      continue;
    }
    else {                      /* Error; exit loop, handle below */
      free(decomp);
      return exit_zlib(z, &k->zlib_init, process_zlib_error(conn, z));
    }
  }
  /* Will never get here */
}